

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_225155::OSSPlayback::stop(OSSPlayback *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  thread *in_RDI;
  
  bVar1 = std::atomic<bool>::exchange((atomic<bool> *)(in_RDI + 6),true,memory_order_acq_rel);
  if ((!bVar1) && (bVar1 = std::thread::joinable(in_RDI), bVar1)) {
    std::thread::join();
    iVar2 = ioctl((int)in_RDI[2]._M_id._M_thread,0x5000);
    __stream = gLogFile;
    if ((iVar2 != 0) && (0 < (int)gLogLevel)) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf((FILE *)__stream,"[ALSOFT] (EE) Error resetting device: %s\n",pcVar4);
    }
  }
  return;
}

Assistant:

void OSSPlayback::stop()
{
    if(mKillNow.exchange(true, std::memory_order_acq_rel) || !mThread.joinable())
        return;
    mThread.join();

    if(ioctl(mFd, SNDCTL_DSP_RESET) != 0)
        ERR("Error resetting device: %s\n", strerror(errno));
}